

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::piece_picker::inc_refcount
          (piece_picker *this,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bitmask,torrent_peer *peer)

{
  piece_pos *this_00;
  piece_index_t index;
  prio_index_t elem_index;
  uint uVar1;
  _Head_base<0UL,_unsigned_int_*,_false> _Var2;
  pointer ppVar3;
  piece_picker *this_01;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  bool *pbVar8;
  uint *puVar9;
  ulong uVar10;
  undefined1 *puVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  undefined1 auStack_68 [8];
  ulong local_60;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *local_58;
  ulong local_50;
  ulong local_48;
  undefined1 *local_40;
  piece_picker *local_38;
  
  puVar11 = auStack_68;
  bVar4 = bitfield::none_set(&bitmask->super_bitfield);
  if (bVar4) {
    return;
  }
  bVar4 = bitfield::all_set(&bitmask->super_bitfield);
  if (bVar4) {
    _Var2._M_head_impl =
         *(uint **)&(bitmask->super_bitfield).m_buf.
                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
    if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var2._M_head_impl ==
        (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *_Var2._M_head_impl;
    }
    if (uVar5 == (uint)((ulong)((long)(this->m_piece_map).
                                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                      .
                                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_piece_map).
                                     super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                     .
                                     super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      iVar6 = this->m_seeds;
      this->m_seeds = iVar6 + 1;
      if (iVar6 != 0) {
        return;
      }
      pbVar8 = &this->m_dirty;
      goto LAB_00291231;
    }
  }
  _Var2._M_head_impl =
       *(uint **)&(bitmask->super_bitfield).m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var2._M_head_impl ==
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (int)*_Var2._M_head_impl / 2;
  }
  local_50 = 0x32;
  if ((int)uVar5 < 0x32) {
    local_50 = (ulong)uVar5;
  }
  iVar6 = (int)local_50;
  if ((int)uVar5 < 1) {
    local_40 = (undefined1 *)0x0;
  }
  else {
    puVar11 = auStack_68 + -(ulong)(iVar6 * 4 + 0xfU & 0xfffffff0);
    local_40 = puVar11;
  }
  if (this->m_dirty == false) {
    puVar7 = _Var2._M_head_impl + 1;
    if (_Var2._M_head_impl == (uint *)0x0) {
      uVar5 = 0x80000000;
      puVar9 = (uint *)0x0;
      puVar7 = (uint *)0x0;
    }
    else {
      uVar5 = *_Var2._M_head_impl;
      iVar12 = uVar5 + 0x3e;
      if (-1 < (int)(uVar5 + 0x1f)) {
        iVar12 = uVar5 + 0x1f;
      }
      puVar9 = puVar7 + ((long)(iVar12 >> 5) - (ulong)((uVar5 & 0x1f) != 0));
      uVar5 = 0x80000000 >> (sbyte)(uVar5 & 0x1f);
    }
    local_60 = 0;
    iVar12 = 0;
    uVar13 = 0x80000000;
    do {
      if ((*puVar7 &
          (uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18)) !=
          0) {
        iVar15 = (int)local_60;
        if (iVar15 < iVar6) {
          *(int *)(local_40 + (long)iVar15 * 4) = iVar12;
        }
        local_60 = (ulong)(iVar15 + 1U);
        if (iVar6 <= (int)(iVar15 + 1U)) break;
      }
      bVar4 = uVar13 == 1;
      puVar7 = puVar7 + bVar4;
      uVar13 = uVar13 >> 1;
      if (bVar4) {
        uVar13 = 0x80000000;
      }
      iVar12 = iVar12 + 1;
    } while ((puVar7 != puVar9) || (uVar13 != uVar5));
    if ((int)local_60 < iVar6) {
      local_58 = bitmask;
      local_48 = local_60;
      local_38 = this;
      if (0 < (int)local_60) {
        uVar10 = 0;
        do {
          index.m_val = *(int *)(local_40 + uVar10 * 4);
          this_00 = (this->m_piece_map).
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    .
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start + index.m_val;
          *(undefined8 *)(puVar11 + -8) = 0x2910e3;
          iVar6 = piece_pos::priority(this_00,this);
          *(uint *)this_00 = *(uint *)this_00 & 0xfc000000 | *(uint *)this_00 + 1 & 0x3ffffff;
          *(undefined8 *)(puVar11 + -8) = 0x291109;
          iVar12 = piece_pos::priority(this_00,this);
          this_01 = local_38;
          if (iVar6 != iVar12) {
            if (iVar6 < 0) {
              *(undefined8 *)(puVar11 + -8) = 0x291132;
              add(this_01,index);
            }
            else {
              elem_index.m_val = (this_00->index).m_val;
              *(undefined8 *)(puVar11 + -8) = 0x291124;
              update(this_01,iVar6,elem_index);
            }
          }
          uVar10 = uVar10 + 1;
        } while (local_60 != uVar10);
      }
      bitmask = local_58;
      this = local_38;
      if ((int)local_48 < (int)local_50) {
        return;
      }
    }
  }
  _Var2._M_head_impl =
       *(uint **)&(bitmask->super_bitfield).m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  puVar7 = _Var2._M_head_impl + 1;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var2._M_head_impl ==
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    puVar9 = (uint *)0x0;
    uVar5 = 0x80000000;
    puVar7 = (uint *)0x0;
  }
  else {
    uVar5 = *_Var2._M_head_impl;
    iVar6 = uVar5 + 0x3e;
    if (-1 < (int)(uVar5 + 0x1f)) {
      iVar6 = uVar5 + 0x1f;
    }
    puVar9 = puVar7 + ((long)(iVar6 >> 5) - (ulong)((uVar5 & 0x1f) != 0));
    uVar5 = 0x80000000 >> (sbyte)(uVar5 & 0x1f);
  }
  pbVar8 = &this->m_dirty;
  lVar14 = 0;
  bVar4 = false;
  uVar13 = 0x80000000;
  do {
    if ((*puVar7 &
        (uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18)) != 0)
    {
      ppVar3 = (this->m_piece_map).
               super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
               .
               super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(uint *)((long)&ppVar3->field_0x0 + lVar14);
      *(uint *)((long)&ppVar3->field_0x0 + lVar14) = uVar1 & 0xfc000000 | uVar1 + 1 & 0x3ffffff;
      bVar4 = true;
    }
    bVar16 = uVar13 == 1;
    uVar13 = uVar13 >> 1;
    if (bVar16) {
      uVar13 = 0x80000000;
    }
    puVar7 = puVar7 + bVar16;
    lVar14 = lVar14 + 8;
  } while ((puVar7 != puVar9) || (uVar13 != uVar5));
  if (!bVar4 || (*pbVar8 & 1U) != 0) {
    return;
  }
LAB_00291231:
  *pbVar8 = true;
  return;
}

Assistant:

void piece_picker::inc_refcount(typed_bitfield<piece_index_t> const& bitmask
		, const aux::torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "inc_refcount(bitfield)" << std::endl;
#endif

		// nothing set, nothing to do here
		if (bitmask.none_set()) return;

		if (bitmask.all_set() && bitmask.size() == int(m_piece_map.size()))
		{
			inc_refcount_all(peer);
			return;
		}

		int const size = std::min(50, int(bitmask.size() / 2));

		// this is an optimization where if just a few
		// pieces end up changing, instead of making
		// the piece list dirty, just update those pieces
		// instead
		TORRENT_ALLOCA(incremented, piece_index_t, size);

		if (!m_dirty)
		{
			// first count how many pieces we're updating. If it's few (less than half)
			// we'll just update them one at a time. Otherwise we'll just update the counters
			// and mark the picker as dirty, so we'll rebuild it next time we need it.
			// this only matters if we're not already dirty, in which case the fasted
			// thing to do is to just update the counters and be done
			piece_index_t index{0};
			int num_inc = 0;
			for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
			{
				if (!*i) continue;
				if (num_inc < size) incremented[num_inc] = index;
				++num_inc;
				if (num_inc >= size) break;
			}

			if (num_inc < size)
			{
				// not that many pieces were updated
				// just update those individually instead of
				// rebuilding the whole piece list
				for (int i = 0; i < num_inc; ++i)
				{
					piece_index_t const piece = incremented[i];
					piece_pos& p = m_piece_map[piece];
					int prev_priority = p.priority(this);
					++p.peer_count;
#ifdef TORRENT_DEBUG_REFCOUNTS
					TORRENT_ASSERT(p.have_peers.count(peer) == 0);
					p.have_peers.insert(peer);
#else
					TORRENT_UNUSED(peer);
#endif
					int new_priority = p.priority(this);
					if (prev_priority == new_priority) continue;
					else if (prev_priority >= 0) update(prev_priority, p.index);
					else add(piece);
				}
				return;
			}
		}

		piece_index_t index{0};
		bool updated = false;
		for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
		{
			if (*i)
			{
#ifdef TORRENT_DEBUG_REFCOUNTS
				TORRENT_ASSERT(m_piece_map[index].have_peers.count(peer) == 0);
				m_piece_map[index].have_peers.insert(peer);
#else
				TORRENT_UNUSED(peer);
#endif

				++m_piece_map[index].peer_count;
				updated = true;
			}
		}

		// if we're already dirty, no point in doing anything more
		if (m_dirty) return;

		if (updated) m_dirty = true;
	}